

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ClassRandomizeFunction::checkArguments
          (ClassRandomizeFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *thisExpr)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange callRange;
  bool bVar1;
  size_type sVar2;
  reference ppEVar3;
  Symbol *this_00;
  SourceLocation SVar4;
  undefined8 in_RCX;
  undefined8 *in_RDX;
  Scope *in_RDI;
  undefined8 in_R8;
  long in_R9;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar5;
  pair<const_slang::ast::ClassType_*,_bool> pVar6;
  Symbol *sym;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  Args *__range3;
  Scope *ct;
  Args methodArgs;
  Compilation *comp;
  bool isMethod;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *this_01;
  Type *pTVar7;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_fffffffffffffed8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_fffffffffffffee0;
  SourceLocation in_stack_fffffffffffffee8;
  SourceLocation in_stack_fffffffffffffef0;
  SourceLocation in_stack_fffffffffffffef8;
  DiagCode code;
  undefined8 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  Args *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff3c;
  undefined1 isMethod_00;
  ASTContext *in_stack_ffffffffffffff40;
  SystemSubroutine *in_stack_ffffffffffffff48;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  in_stack_ffffffffffffff50;
  SourceLocation in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff79;
  SourceLocation local_80;
  pointer local_78;
  __extent_storage<18446744073709551615UL> local_70;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_68;
  undefined8 local_58;
  undefined8 local_50;
  Compilation *local_48;
  byte local_39;
  long local_38;
  undefined8 *local_30;
  undefined8 local_18;
  undefined8 local_10;
  Type *local_8;
  
  isMethod_00 = (undefined1)((uint)in_stack_ffffffffffffff3c >> 0x18);
  local_39 = in_R9 != 0;
  local_38 = in_R9;
  local_30 = in_RDX;
  local_18 = in_RCX;
  local_10 = in_R8;
  local_48 = ASTContext::getCompilation((ASTContext *)0xb11f06);
  local_58 = local_18;
  local_50 = local_10;
  this_01 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x0;
  pTVar7 = (Type *)0x7fffffff;
  callRange.endLoc = in_stack_ffffffffffffff58;
  callRange.startLoc = (SourceLocation)in_stack_ffffffffffffff50._M_current;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,(bool)isMethod_00,
                     in_stack_ffffffffffffff30,callRange,in_stack_ffffffffffffff70,
                     CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78));
  if (bVar1) {
    local_68._M_ptr = (pointer)*local_30;
    local_68._M_extent._M_extent_value = local_30[1];
    if ((local_39 & 1) != 0) {
      sVar5 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::subspan
                        (in_stack_fffffffffffffee0,(size_type)in_stack_fffffffffffffed8,
                         (size_type)pTVar7);
      local_78 = sVar5._M_ptr;
      local_68._M_ptr = local_78;
      local_70 = sVar5._M_extent._M_extent_value;
      local_68._M_extent._M_extent_value = local_70._M_extent_value;
    }
    sVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0xb12014
                      );
    if (sVar2 == 1) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                (&local_68,0);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xb12037)
      ;
      bVar1 = Type::isNull((Type *)0xb1203f);
      if (bVar1) {
        pTVar7 = Compilation::getIntType(local_48);
        return pTVar7;
      }
    }
    if (local_38 == 0) {
      not_null<const_slang::ast::Scope_*>::operator*
                ((not_null<const_slang::ast::Scope_*> *)0xb120ca);
      pVar6 = Lookup::getContainingClass(in_RDI);
      in_stack_fffffffffffffee8 = (SourceLocation)0x0;
      local_80 = in_stack_fffffffffffffee8;
      if (pVar6.first != (ClassType *)0x0) {
        in_stack_fffffffffffffee8 = (SourceLocation)&(pVar6.first)->super_Scope;
        local_80 = in_stack_fffffffffffffee8;
      }
    }
    else {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xb1207b)
      ;
      Type::getCanonicalType(pTVar7);
      in_stack_fffffffffffffef0 =
           (SourceLocation)Symbol::as<slang::ast::ClassType>((Symbol *)0xb1208b);
      in_stack_fffffffffffffef8 = (SourceLocation)0x0;
      local_80 = in_stack_fffffffffffffef8;
      if (in_stack_fffffffffffffef0 != (SourceLocation)0x0) {
        in_stack_fffffffffffffef8 = (SourceLocation)((long)in_stack_fffffffffffffef0 + 0x48);
        local_80 = in_stack_fffffffffffffef8;
      }
    }
    if (local_80 == (SourceLocation)0x0) {
      local_8 = Compilation::getErrorType(local_48);
    }
    else {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin(this_01);
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                (in_stack_fffffffffffffed8);
      while (bVar1 = __gnu_cxx::
                     operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                 *)pTVar7,
                                (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                 *)this_01), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppEVar3 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                  ::operator*((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)&stack0xffffffffffffff50);
        if ((*ppEVar3)->kind != NamedValue) {
          sourceRange.endLoc = in_stack_fffffffffffffef8;
          sourceRange.startLoc = in_stack_fffffffffffffef0;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffee8,SUB84((ulong)in_RDI >> 0x20,0)
                              ,sourceRange);
          pTVar7 = Compilation::getErrorType(local_48);
          return pTVar7;
        }
        this_00 = Expression::getSymbolReference
                            ((Expression *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                             SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0));
        code = SUB84((ulong)in_RDI >> 0x20,0);
        if ((this_00 == (Symbol *)0x0) || (this_00->kind != ClassProperty)) {
LAB_00b12262:
          sourceRange_00.endLoc = in_stack_fffffffffffffef8;
          sourceRange_00.startLoc = in_stack_fffffffffffffef0;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffee8,code,sourceRange_00);
          pTVar7 = Compilation::getErrorType(local_48);
          return pTVar7;
        }
        SVar4 = (SourceLocation)Symbol::getParentScope(this_00);
        code = SUB84((ulong)in_RDI >> 0x20,0);
        if (SVar4 != local_80) goto LAB_00b12262;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      *)&stack0xffffffffffffff50);
      }
      local_8 = Compilation::getIntType(local_48);
    }
  }
  else {
    local_8 = Compilation::getErrorType(local_48);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* thisExpr) const final {
        bool isMethod = thisExpr != nullptr;
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, isMethod, args, range, 0, INT32_MAX))
            return comp.getErrorType();

        Args methodArgs = args;
        if (isMethod)
            methodArgs = methodArgs.subspan(1);

        // Special case: a single 'null' argument can be passed to indicate
        // that no variables should be randomized.
        if (methodArgs.size() == 1 && methodArgs[0]->type->isNull())
            return comp.getIntType();

        // This can only be called via a special lookup on a class handle or as a local
        // class member, so we know either the this expression gives us the class type
        // or we can look it up from our current scope.
        const Scope* ct;
        if (thisExpr)
            ct = &thisExpr->type->getCanonicalType().as<ClassType>();
        else
            ct = Lookup::getContainingClass(*context.scope).first;

        if (!ct)
            return comp.getErrorType();

        for (auto arg : methodArgs) {
            if (arg->kind != ExpressionKind::NamedValue) {
                context.addDiag(diag::ExpectedClassPropertyName, arg->sourceRange);
                return comp.getErrorType();
            }

            auto sym = arg->getSymbolReference();
            if (!sym || sym->kind != SymbolKind::ClassProperty || sym->getParentScope() != ct) {
                context.addDiag(diag::ExpectedClassPropertyName, arg->sourceRange);
                return comp.getErrorType();
            }
        }

        return comp.getIntType();
    }